

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O0

ArgStatus despot::option::Arg::Required(Option *option,bool msg)

{
  bool msg_local;
  Option *option_local;
  
  if (option->arg == (char *)0x0) {
    if (msg) {
      printError("Option \'",option,"\' requires an argument\n");
      exit(1);
    }
    option_local._4_4_ = ARG_ILLEGAL;
  }
  else {
    option_local._4_4_ = ARG_OK;
  }
  return option_local._4_4_;
}

Assistant:

static option::ArgStatus Required(const option::Option& option, bool msg) {
		if (option.arg != 0)
			return option::ARG_OK;
		if (msg) {
			printError("Option '", option, "' requires an argument\n");
			exit(1);
		}
		return option::ARG_ILLEGAL;
	}